

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O2

void __thiscall registerEntity::test_method(registerEntity *this)

{
  string *psVar1;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  char *local_100;
  allocator<char> local_f0 [8];
  undefined8 local_e8;
  shared_count asStack_e0 [9];
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char *local_48;
  char *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  char *local_20;
  
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"myEntity",local_f0);
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"myEntity",local_f0);
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_20 = "";
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28,0x2e);
  local_f0[0] = (allocator<char>)0x0;
  local_e8 = 0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0010cb90;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "Should never happen.";
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_40 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_e0);
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"myEntity",local_f0);
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x36);
  local_f0[0] = (allocator<char>)0x0;
  local_e8 = 0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0010cb90;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "Should never happen.";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_90 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_e0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(registerEntity) {
  dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                              &makeEntity);

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                                &makeEntity);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity", 0);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }
}